

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ym2612.cpp
# Opt level: O0

void __thiscall LibGens::Ym2612::Ym2612(Ym2612 *this)

{
  Ym2612Private *this_00;
  Ym2612 *this_local;
  
  this_00 = (Ym2612Private *)operator_new(0x77e8);
  Ym2612Private::Ym2612Private(this_00,this);
  this->d = this_00;
  this->m_writeLen = 0;
  this->m_enabled = true;
  this->m_dacEnabled = true;
  this->m_improved = true;
  return;
}

Assistant:

Ym2612::Ym2612()
	: d(new Ym2612Private(this))
{
	// TODO: Some initialization should go here!
	m_writeLen = 0;
	m_enabled = true;	// TODO: Make this customizable.
	m_dacEnabled = true;	// TODO: Make this customizable.
	m_improved = true;	// TODO: Make this customizable.
}